

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::save
          (section_impl<ELFIO::Elf64_Shdr> *this,ostream *f,streampos header_offset,
          streampos data_offset)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  uVar3 = data_offset._M_off;
  iVar1 = (*(this->super_section)._vptr_section[2])();
  if ((short)iVar1 != 0) {
    uVar2 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    if ((this->convertor).need_conversion == false) {
      uVar2 = uVar3;
    }
    (this->header).sh_offset = uVar2;
  }
  std::ostream::seekp(f,header_offset._M_off,header_offset._M_state);
  std::ostream::write((char *)f,(long)&this->header);
  iVar1 = (*(this->super_section)._vptr_section[5])(this);
  if (iVar1 != 8) {
    iVar1 = (*(this->super_section)._vptr_section[5])(this);
    if (iVar1 != 0) {
      iVar1 = (*(this->super_section)._vptr_section[0x13])(this);
      if ((CONCAT44(extraout_var,iVar1) != 0) && (this->data != (char *)0x0)) {
        save_data(this,f,data_offset);
        return;
      }
    }
  }
  return;
}

Assistant:

void
    save( std::ostream&  f,
          std::streampos header_offset,
          std::streampos data_offset )
    {
        if ( 0 != get_index() ) {
            header.sh_offset = data_offset;
            header.sh_offset = convertor( header.sh_offset );
        }

        save_header( f, header_offset );
        if ( get_type() != SHT_NOBITS && get_type() != SHT_NULL &&
             get_size() != 0 && data != 0 ) {
            save_data( f, data_offset );
        }
    }